

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonteCarloPricer.h
# Opt level: O1

PriceCI * __thiscall
MonteCarloPricer::priceClassic<DigitalPut>
          (PriceCI *__return_storage_ptr__,MonteCarloPricer *this,BlackScholesModel *model,
          DigitalPut *option)

{
  PriceCI *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar4;
  double dVar5;
  double payoff_std;
  double payoff_mean;
  double local_50;
  double local_48;
  PriceCI *local_40;
  double local_38;
  
  iVar2 = this->num_sims;
  local_40 = __return_storage_ptr__;
  if (iVar2 < 1) {
    dVar5 = 0.0;
    dVar4 = 0.0;
  }
  else {
    dVar4 = 0.0;
    iVar3 = 0;
    dVar5 = 0.0;
    do {
      local_38 = dVar5;
      local_50 = Option::getMaturity((Option *)option);
      local_48 = BlackScholesModel::generatePrice(model,&local_50);
      (*(option->super_PathIndependentOption).super_Option._vptr_Option[1])(option,&local_48);
      dVar5 = local_38 + (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      dVar4 = dVar4 + (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) *
                      (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      iVar3 = iVar3 + 1;
      iVar2 = this->num_sims;
    } while (iVar3 < iVar2);
  }
  local_48 = dVar5 / (double)iVar2;
  local_50 = dVar4 / (double)iVar2 - local_48 * local_48;
  dVar4 = BlackScholesModel::getRiskFreeRate(model);
  dVar5 = Option::getMaturity((Option *)option);
  dVar4 = exp(dVar5 * -dVar4);
  local_48 = dVar4 * local_48;
  dVar4 = BlackScholesModel::getRiskFreeRate(model);
  dVar5 = Option::getMaturity((Option *)option);
  dVar4 = exp(dVar5 * dVar4 * -2.0);
  pPVar1 = local_40;
  local_50 = dVar4 * local_50;
  PriceCI::PriceCI(local_40,&local_48,&local_50,&this->num_sims);
  return pPVar1;
}

Assistant:

inline PriceCI MonteCarloPricer::priceClassic(BlackScholesModel const& model, pathIndependentOption const& option) const
{
	double payoff, payoff_sum = 0.0, payoff_sq_mean = 0.0;
	for (int i = 0; i < num_sims; i++) {
		payoff = option.payoff(model.generatePrice(option.getMaturity()));
		payoff_sum += payoff;
		payoff_sq_mean += payoff * payoff;
	}
	double payoff_mean = payoff_sum / static_cast<double>(num_sims);
	double payoff_std = (payoff_sq_mean / static_cast<double>(num_sims)) - payoff_mean * payoff_mean;
	payoff_mean *= exp(-model.getRiskFreeRate() * option.getMaturity());
	payoff_std *= exp(-2 * model.getRiskFreeRate() * option.getMaturity());
	return { payoff_mean, payoff_std, num_sims };
}